

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_conversion.cpp
# Opt level: O2

string * skiwi::get_variable_name_before_alpha
                   (string *__return_storage_ptr__,string *variable_name_after_alpha)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  string alpha_index_nr;
  
  lVar2 = std::__cxx11::string::rfind((char)variable_name_after_alpha,0x5f);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)variable_name_after_alpha);
  if (lVar2 == -1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&alpha_index_nr,(ulong)variable_name_after_alpha);
  if (alpha_index_nr._M_string_length != 0) {
    pcVar1 = alpha_index_nr._M_dataplus._M_p + alpha_index_nr._M_string_length;
    pcVar3 = alpha_index_nr._M_dataplus._M_p + 1;
    for (lVar2 = (long)alpha_index_nr._M_string_length >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
      if ((int)pcVar3[-1] - 0x3aU < 0xfffffff6) {
        pcVar3 = pcVar3 + -1;
        goto LAB_001a8036;
      }
      if ((int)*pcVar3 - 0x3aU < 0xfffffff6) goto LAB_001a8036;
      if ((int)pcVar3[1] - 0x3aU < 0xfffffff6) {
        pcVar3 = pcVar3 + 1;
        goto LAB_001a8036;
      }
      if ((int)pcVar3[2] - 0x3aU < 0xfffffff6) {
        pcVar3 = pcVar3 + 2;
        goto LAB_001a8036;
      }
      pcVar3 = pcVar3 + 4;
      alpha_index_nr._M_string_length = alpha_index_nr._M_string_length - 4;
    }
    pcVar5 = pcVar3 + -1;
    if (alpha_index_nr._M_string_length == 1) {
LAB_001a8077:
      pcVar3 = pcVar5;
      if (0xfffffff5 < (int)*pcVar5 - 0x3aU) {
        pcVar3 = pcVar1;
      }
    }
    else if (alpha_index_nr._M_string_length == 3) {
      pcVar4 = pcVar3;
      pcVar3 = pcVar5;
      if (0xfffffff5 < (int)*pcVar5 - 0x3aU) goto LAB_001a8066;
    }
    else {
      pcVar4 = pcVar5;
      if (alpha_index_nr._M_string_length != 2) goto LAB_001a8046;
LAB_001a8066:
      pcVar3 = pcVar4;
      if (0xfffffff5 < (int)*pcVar4 - 0x3aU) {
        pcVar5 = pcVar4 + 1;
        goto LAB_001a8077;
      }
    }
LAB_001a8036:
    if (pcVar3 == pcVar1) goto LAB_001a8046;
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_001a8046:
  std::__cxx11::string::~string((string *)&alpha_index_nr);
  return __return_storage_ptr__;
}

Assistant:

std::string get_variable_name_before_alpha(const std::string& variable_name_after_alpha)
  {
  auto pos = variable_name_after_alpha.find_last_of('_');
  std::string name_before_alpha_conversion = variable_name_after_alpha.substr(0, pos);
  if (pos != std::string::npos)
    {
    std::string alpha_index_nr = variable_name_after_alpha.substr(pos + 1);
    bool is_number = !alpha_index_nr.empty() &&
      std::find_if(alpha_index_nr.begin(), alpha_index_nr.end(), [](char c) { return !std::isdigit(c); }) == alpha_index_nr.end();
    if (!is_number)
      name_before_alpha_conversion = variable_name_after_alpha;
    }
  return name_before_alpha_conversion;
  }